

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_fast.c
# Opt level: O3

block_state deflate_fast(deflate_state *s,int flush)

{
  byte bVar1;
  Pos PVar2;
  uint32_t uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint32_t str;
  ulong uVar8;
  uchar *puVar9;
  
LAB_00102661:
  do {
    if (s->lookahead < 0x106) {
      zng_fill_window(s);
      uVar7 = s->lookahead;
      if (flush == 0 && uVar7 < 0x106) {
        return need_more;
      }
      if (uVar7 == 0) {
        uVar5 = s->strstart;
        uVar7 = 2;
        if (uVar5 < 2) {
          uVar7 = uVar5;
        }
        s->insert = uVar7;
        if (flush == 4) {
          iVar6 = s->block_start;
          if ((long)iVar6 < 0) {
            puVar9 = (uchar *)0x0;
          }
          else {
            puVar9 = s->window + iVar6;
          }
          zng_tr_flush_block(s,(char *)puVar9,uVar5 - iVar6,1);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          return finish_done - (s->strm->avail_out == 0);
        }
        if (s->sym_next != 0) {
          iVar6 = s->block_start;
          if ((long)iVar6 < 0) {
            puVar9 = (uchar *)0x0;
          }
          else {
            puVar9 = s->window + iVar6;
          }
          zng_tr_flush_block(s,(char *)puVar9,uVar5 - iVar6,0);
          s->block_start = s->strstart;
          zng_flush_pending(s->strm);
          if (s->strm->avail_out == 0) {
            return need_more;
          }
        }
        return block_done;
      }
      uVar5 = s->strstart;
      uVar8 = (ulong)uVar5;
      if (3 < uVar7) goto LAB_001026aa;
LAB_001027c3:
      bVar1 = s->window[uVar8];
      uVar5 = s->sym_next;
      s->d_buf[uVar5] = 0;
      s->sym_next = uVar5 + 1;
      s->l_buf[uVar5] = bVar1;
      s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
      s->lookahead = s->lookahead - 1;
      s->strstart = s->strstart + 1;
      if (s->sym_next != s->sym_end) goto LAB_00102661;
    }
    else {
      uVar5 = s->strstart;
LAB_001026aa:
      PVar2 = quick_insert_string(s,uVar5);
      uVar8 = (ulong)s->strstart;
      if (((PVar2 == 0) || ((long)(uVar8 - PVar2) < 1)) ||
         ((long)(ulong)(s->w_size - 0x106) < (long)(uVar8 - PVar2))) goto LAB_001027c3;
      uVar3 = (*functable.longest_match)(s,PVar2);
      uVar8 = (ulong)s->strstart;
      if (uVar3 < 4) goto LAB_001027c3;
      iVar6 = s->strstart - s->match_start;
      uVar5 = s->sym_next;
      s->d_buf[uVar5] = (uint16_t)iVar6;
      s->sym_next = uVar5 + 1;
      s->l_buf[uVar5] = (uchar)(uVar3 - 3);
      s->matches = s->matches + 1;
      s->dyn_ltree[(ulong)""[uVar3 - 3] + 0x101].fc.freq =
           s->dyn_ltree[(ulong)""[uVar3 - 3] + 0x101].fc.freq + 1;
      uVar7 = iVar6 - 1;
      uVar5 = (uVar7 >> 7) + 0x100;
      if (uVar7 < 0x100) {
        uVar5 = uVar7;
      }
      s->dyn_dtree[""[uVar5]].fc.freq = s->dyn_dtree[""[uVar5]].fc.freq + 1;
      uVar5 = s->sym_next;
      uVar7 = s->sym_end;
      uVar4 = s->lookahead - uVar3;
      s->lookahead = uVar4;
      if (s->max_lazy_match < uVar3 || uVar4 < 4) {
        uVar4 = s->strstart;
        s->strstart = uVar4 + uVar3;
        quick_insert_string(s,(uVar4 + uVar3) - 1);
      }
      else {
        str = s->strstart + 1;
        s->strstart = str;
        insert_string(s,str,uVar3 - 1);
        s->strstart = s->strstart + (uVar3 - 1);
      }
      if (uVar5 != uVar7) goto LAB_00102661;
    }
    iVar6 = s->block_start;
    if ((long)iVar6 < 0) {
      puVar9 = (uchar *)0x0;
    }
    else {
      puVar9 = s->window + iVar6;
    }
    zng_tr_flush_block(s,(char *)puVar9,s->strstart - iVar6,0);
    s->block_start = s->strstart;
    zng_flush_pending(s->strm);
    if (s->strm->avail_out == 0) {
      return need_more;
    }
  } while( true );
}

Assistant:

Z_INTERNAL block_state deflate_fast(deflate_state *s, int flush) {
    Pos hash_head;        /* head of the hash chain */
    int bflush = 0;       /* set if current block must be flushed */
    int64_t dist;
    uint32_t match_len = 0;

    for (;;) {
        /* Make sure that we always have enough lookahead, except
         * at the end of the input file. We need STD_MAX_MATCH bytes
         * for the next match, plus WANT_MIN_MATCH bytes to insert the
         * string following the next match.
         */
        if (s->lookahead < MIN_LOOKAHEAD) {
            PREFIX(fill_window)(s);
            if (UNLIKELY(s->lookahead < MIN_LOOKAHEAD && flush == Z_NO_FLUSH)) {
                return need_more;
            }
            if (UNLIKELY(s->lookahead == 0))
                break; /* flush the current block */
        }

        /* Insert the string window[strstart .. strstart+2] in the
         * dictionary, and set hash_head to the head of the hash chain:
         */
        if (s->lookahead >= WANT_MIN_MATCH) {
            hash_head = quick_insert_string(s, s->strstart);
            dist = (int64_t)s->strstart - hash_head;

            /* Find the longest match, discarding those <= prev_length.
             * At this point we have always match length < WANT_MIN_MATCH
             */
            if (dist <= MAX_DIST(s) && dist > 0 && hash_head != 0) {
                /* To simplify the code, we prevent matches with the string
                 * of window index 0 (in particular we have to avoid a match
                 * of the string with itself at the start of the input file).
                 */
                match_len = FUNCTABLE_CALL(longest_match)(s, hash_head);
                /* longest_match() sets match_start */
            }
        }

        if (match_len >= WANT_MIN_MATCH) {
            Assert(s->strstart <= UINT16_MAX, "strstart should fit in uint16_t");
            Assert(s->match_start <= UINT16_MAX, "match_start should fit in uint16_t");
            check_match(s, (Pos)s->strstart, (Pos)s->match_start, match_len);

            bflush = zng_tr_tally_dist(s, s->strstart - s->match_start, match_len - STD_MIN_MATCH);

            s->lookahead -= match_len;

            /* Insert new strings in the hash table only if the match length
             * is not too large. This saves time but degrades compression.
             */
            if (match_len <= s->max_insert_length && s->lookahead >= WANT_MIN_MATCH) {
                match_len--; /* string at strstart already in table */
                s->strstart++;

                insert_string(s, s->strstart, match_len);
                s->strstart += match_len;
            } else {
                s->strstart += match_len;
                quick_insert_string(s, s->strstart + 2 - STD_MIN_MATCH);

                /* If lookahead < STD_MIN_MATCH, ins_h is garbage, but it does not
                 * matter since it will be recomputed at next deflate call.
                 */
            }
            match_len = 0;
        } else {
            /* No match, output a literal byte */
            bflush = zng_tr_tally_lit(s, s->window[s->strstart]);
            s->lookahead--;
            s->strstart++;
        }
        if (UNLIKELY(bflush))
            FLUSH_BLOCK(s, 0);
    }
    s->insert = s->strstart < (STD_MIN_MATCH - 1) ? s->strstart : (STD_MIN_MATCH - 1);
    if (UNLIKELY(flush == Z_FINISH)) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (UNLIKELY(s->sym_next))
        FLUSH_BLOCK(s, 0);
    return block_done;
}